

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O2

void __thiscall BoundaryElement::run_GMRES(BoundaryElement *this)

{
  Timers_BoundaryElement *pTVar1;
  Output *pOVar2;
  int iVar3;
  rep rVar4;
  ostream *poVar5;
  long n;
  allocator_type local_69;
  long num_iter;
  double residual;
  vector<double,_std::allocator<double>_> h_vec;
  vector<double,_std::allocator<double>_> work_vec;
  
  pTVar1 = this->timers_;
  rVar4 = std::chrono::_V2::steady_clock::now();
  (pTVar1->run_GMRES).start_time_.__d.__r = rVar4;
  n = (long)(this->output_->potential_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->output_->potential_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3;
  residual = 0.0001;
  num_iter = 100;
  std::vector<double,_std::allocator<double>_>::vector(&work_vec,n * 0xe,(allocator_type *)&h_vec);
  std::vector<double,_std::allocator<double>_>::vector(&h_vec,0x84,&local_69);
  copyin_clusters_to_device(this);
  iVar3 = gmres_(this,n,(this->elements_->source_term_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                 (this->output_->potential_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start,10,
                 work_vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,n,
                 h_vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,0xb,&num_iter,&residual);
  delete_clusters_from_device(this);
  pOVar2 = this->output_;
  pOVar2->residual_ = residual;
  pOVar2->num_iter_ = num_iter;
  if (iVar3 == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"GMRES completed. ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::operator<<(poVar5," iterations, ");
    poVar5 = std::ostream::_M_insert<double>(residual);
    std::operator<<(poVar5," residual.");
    Timer::stop(&this->timers_->run_GMRES);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&h_vec.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&work_vec.super__Vector_base<double,_std::allocator<double>_>);
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"GMRES error code ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  std::operator<<(poVar5,". Exiting.");
  exit(1);
}

Assistant:

void BoundaryElement::run_GMRES()
{
    timers_.run_GMRES.start();

    long int restrt = 10;
    long int length = output_.potential().size();
    long int ldw    = length;
    long int ldh    = restrt + 1;
    
    // These values are modified on return
    double residual   = 1e-4;
    long int num_iter = 100;

    std::vector<double> work_vec(ldw * (restrt + 4));
    std::vector<double> h_vec   (ldh * (restrt + 2));
    
    double* work = work_vec.data();
    double* h    = h_vec.data();

    BoundaryElement::copyin_clusters_to_device();
    
    int err_code = BoundaryElement::gmres_(length, elements_.source_term_ptr(), output_.potential().data(),
                                    restrt, work, ldw, h, ldh, num_iter, residual);

    BoundaryElement::delete_clusters_from_device();
    
    output_.set_residual(residual);
    output_.set_num_iter(num_iter);

    if (err_code) {
        std::cout << "GMRES error code " << err_code << ". Exiting.";
        std::exit(1);
    }
    
    std::cout << "GMRES completed. " << num_iter << " iterations, " << residual << " residual.";

    timers_.run_GMRES.stop();
}